

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O3

bool ppmb_write(string *output_name,int xsize,int ysize,uchar *r,uchar *g,uchar *b)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  uint maxrgb;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  long lVar9;
  uint uVar10;
  ofstream output;
  long local_230;
  filebuf local_228 [24];
  uint auStack_210 [54];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)(output_name->_M_dataplus)._M_p);
  uVar1 = *(uint *)((long)auStack_210 + *(long *)(local_230 + -0x18));
  if ((uVar1 & 5) == 0) {
    if (ysize < 1) {
      maxrgb = 0;
    }
    else {
      lVar3 = (ulong)(xsize - 1) + 1;
      maxrgb = 0;
      iVar4 = 0;
      puVar5 = r;
      puVar6 = b;
      puVar7 = g;
      do {
        puVar8 = puVar7;
        if (0 < xsize) {
          puVar8 = puVar7 + lVar3;
          lVar9 = 0;
          do {
            if (maxrgb < puVar5[lVar9]) {
              maxrgb = (uint)puVar5[lVar9];
            }
            uVar10 = (uint)puVar7[lVar9];
            if (puVar7[lVar9] <= maxrgb) {
              uVar10 = maxrgb;
            }
            maxrgb = (uint)puVar6[lVar9];
            if (puVar6[lVar9] <= uVar10) {
              maxrgb = uVar10;
            }
            lVar9 = lVar9 + 1;
          } while (xsize != (int)lVar9);
          puVar5 = puVar5 + lVar3;
          puVar6 = puVar6 + lVar3;
        }
        iVar4 = iVar4 + 1;
        puVar7 = puVar8;
      } while (iVar4 != ysize);
    }
    ppmb_write_header((ofstream *)&local_230,xsize,ysize,maxrgb);
    ppmb_write_data((ofstream *)&local_230,xsize,ysize,r,g,b);
    std::ofstream::close();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PPMB_WRITE: Fatal error!\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Cannot open the output file ",0x1e);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(output_name->_M_dataplus)._M_p,
                        output_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return (uVar1 & 5) != 0;
}

Assistant:

bool ppmb_write ( string output_name, int xsize, int ysize, 
  unsigned char *r, unsigned char *g, unsigned char *b )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_WRITE writes the header and data for a binary portable pixel map file.
//
//  Discussion:
//
//    Thanks to Jonas Schwertfeger for pointing out that, especially on Microsoft
//    Windows systems, a binary file needs to be opened as a binary file!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
// 
//    11 April 2003
// 
//  Author:
// 
//    John Burkardt
//
//  Parameters:
//
//    Input, string OUTPUT_NAME, the name of the file to contain the binary
//    portable pixel map data.
//
//    Input, int XSIZE, YSIZE, the number of rows and columns of data.
//
//    Input, unsigned char *R, *G, *B, the arrays of XSIZE by YSIZE 
//    data values.
//
//    Output, bool PPMB_WRITE, is true if an error occurred.
//
{
  bool error;
  ofstream output;
  int i;
  unsigned char *indexb;
  unsigned char *indexg;
  unsigned char *indexr;
  int j;
  int maxrgb;
//
//  Open the output file.
//
  output.open ( output_name.c_str ( ), ios::binary );

  if ( !output )
  {
    cout << "\n";
    cout << "PPMB_WRITE: Fatal error!\n";
    cout << "  Cannot open the output file " << output_name << ".\n";
    return true;
  }
//
//  Compute the maximum.
//
  maxrgb = 0;
  indexr = r;
  indexg = g;
  indexb = b;

  for ( j = 0; j < ysize; j++ )
  {
    for ( i = 0; i < xsize; i++ )
    {
      maxrgb = i4_max ( maxrgb, *indexr );
      maxrgb = i4_max ( maxrgb, *indexg );
      maxrgb = i4_max ( maxrgb, *indexb );
      indexr = indexr + 1;
      indexg = indexg + 1;
      indexb = indexb + 1;
    }
  }
//
//  Write the header.
//
  error = ppmb_write_header ( output, xsize, ysize, maxrgb );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE: Fatal error!\n";
    cout << "  PPMB_WRITE_HEADER failed.\n";
    return true;
  }
//
//  Write the data.
//
  error = ppmb_write_data ( output, xsize, ysize, r, g, b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE: Fatal error!\n";
    cout << "  PPMB_WRITE_DATA failed.\n";
    return true;
  }
//
//  Close the file.
//
  output.close ( );

  return false;
}